

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

void print_values(longlong byte_offset,size_t bit_offset,size_t bits_available)

{
  ostream *poVar1;
  void *this;
  size_t bits_available_local;
  size_t bit_offset_local;
  longlong byte_offset_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"byte offset = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,byte_offset);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"bit offset = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bit_offset);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"bits available = ");
  this = (void *)std::ostream::operator<<(poVar1,bits_available);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
print_values(long long byte_offset, size_t bit_offset, size_t bits_available)
{
    std::cout << "byte offset = " << byte_offset << ", " << "bit offset = " << bit_offset << ", "
              << "bits available = " << bits_available << std::endl;
}